

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall pugi::xpath_query::xpath_query(xpath_query *this,xpath_query *rhs)

{
  ptrdiff_t pVar1;
  xpath_parse_result local_28;
  
  xpath_parse_result::xpath_parse_result(&this->_result);
  this->_impl = rhs->_impl;
  pVar1 = (rhs->_result).offset;
  (this->_result).error = (rhs->_result).error;
  (this->_result).offset = pVar1;
  rhs->_impl = (void *)0x0;
  xpath_parse_result::xpath_parse_result(&local_28);
  (rhs->_result).error = local_28.error;
  (rhs->_result).offset = local_28.offset;
  return;
}

Assistant:

PUGI_IMPL_FN xpath_query::xpath_query(xpath_query&& rhs) PUGIXML_NOEXCEPT
	{
		_impl = rhs._impl;
		_result = rhs._result;
		rhs._impl = NULL;
		rhs._result = xpath_parse_result();
	}